

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

int NGA_Update_ghost_dir(int g_a,int dimension,int dir,int flag)

{
  logical lVar1;
  
  lVar1 = pnga_update_ghost_dir((long)g_a,(long)dimension + 1,(long)dir,(long)flag);
  return (int)lVar1;
}

Assistant:

int NGA_Update_ghost_dir(int g_a, int dimension, int dir, int flag)
{
    Integer a=(Integer)g_a;
    Integer idim = (Integer)dimension;
    Integer idir = (Integer)dir;
    logical iflag = (logical)flag;
    logical st;
    idim++;
    st = wnga_update_ghost_dir(a,idim,idir,iflag);
    return (int)st;
}